

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceDataEntry *
findFirstExisting(char *path,char *name,UBool *isRoot,UBool *hasChopped,UBool *isDefault,
                 UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *__s2;
  size_t __n;
  bool bVar3;
  char *defaultLoc;
  UResourceDataEntry *pUStack_48;
  UBool hasRealData;
  UResourceDataEntry *r;
  UErrorCode *status_local;
  UBool *isDefault_local;
  UBool *hasChopped_local;
  UBool *isRoot_local;
  char *name_local;
  char *path_local;
  
  pUStack_48 = (UResourceDataEntry *)0x0;
  bVar3 = false;
  __s2 = uloc_getDefault_63();
  *hasChopped = '\x01';
  while( true ) {
    if (*hasChopped == '\0' || bVar3) {
      return pUStack_48;
    }
    pUStack_48 = init_entry(name,path,status);
    UVar1 = U_FAILURE(*status);
    if (UVar1 != '\0') break;
    __n = strlen(name);
    iVar2 = strncmp(name,__s2,__n);
    *isDefault = iVar2 == 0;
    bVar3 = pUStack_48->fBogus == U_ZERO_ERROR;
    if (bVar3) {
      strcpy(name,pUStack_48->fName);
    }
    else {
      pUStack_48->fCountExisting = pUStack_48->fCountExisting - 1;
      pUStack_48 = (UResourceDataEntry *)0x0;
      *status = U_ERROR_WARNING_START;
    }
    iVar2 = strcmp(name,"root");
    *isRoot = iVar2 == 0;
    UVar1 = chopLocale(name);
    *hasChopped = UVar1;
  }
  return (UResourceDataEntry *)0x0;
}

Assistant:

static UResourceDataEntry *
findFirstExisting(const char* path, char* name,
                  UBool *isRoot, UBool *hasChopped, UBool *isDefault, UErrorCode* status) {
    UResourceDataEntry *r = NULL;
    UBool hasRealData = FALSE;
    const char *defaultLoc = uloc_getDefault();
    *hasChopped = TRUE; /* we're starting with a fresh name */

    while(*hasChopped && !hasRealData) {
        r = init_entry(name, path, status);
        /* Null pointer test */
        if (U_FAILURE(*status)) {
            return NULL;
        }
        *isDefault = (UBool)(uprv_strncmp(name, defaultLoc, uprv_strlen(name)) == 0);
        hasRealData = (UBool)(r->fBogus == U_ZERO_ERROR);
        if(!hasRealData) {
            /* this entry is not real. We will discard it. */
            /* However, the parent line for this entry is  */
            /* not to be used - as there might be parent   */
            /* lines in cache from previous openings that  */
            /* are not updated yet. */
            r->fCountExisting--;
            /*entryCloseInt(r);*/
            r = NULL;
            *status = U_USING_FALLBACK_WARNING;
        } else {
            uprv_strcpy(name, r->fName); /* this is needed for supporting aliases */
        }

        *isRoot = (UBool)(uprv_strcmp(name, kRootLocaleName) == 0);

        /*Fallback data stuff*/
        *hasChopped = chopLocale(name);
    }
    return r;
}